

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

SceneW * __thiscall SceneW::writeXml_abi_cxx11_(SceneW *this,int indent)

{
  ostream *poVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppWVar4;
  int in_EDX;
  undefined4 in_register_00000034;
  Widget *this_00;
  string local_268 [36];
  int local_244;
  string local_240 [4];
  int i;
  allocator local_219;
  string local_218 [32];
  Util local_1f8 [48];
  Util local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream str;
  ostream local_198 [380];
  int local_1c;
  Widget *pWStack_18;
  int indent_local;
  SceneW *this_local;
  
  this_00 = (Widget *)CONCAT44(in_register_00000034,indent);
  local_1c = in_EDX;
  pWStack_18 = this_00;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  Util::getIndent_abi_cxx11_(local_1c8,local_1c);
  poVar1 = std::operator<<(local_198,(string *)local_1c8);
  std::operator<<(poVar1,"<Scene");
  std::__cxx11::string::~string((string *)local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"title",&local_219);
  std::__cxx11::string::string(local_240,(string *)(this_00 + 1));
  Util::writeXmlAttribute<std::__cxx11::string>
            (local_1f8,(stringstream *)local_1a8,(string *)local_218,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  Widget::writeXmlAttributes(this_00,(stringstream *)local_1a8);
  poVar1 = std::operator<<(local_198,">");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_244 = 0;
  while( true ) {
    uVar2 = (ulong)local_244;
    sVar3 = std::vector<Widget_*,_std::allocator<Widget_*>_>::size(&this_00->children);
    if (sVar3 <= uVar2) break;
    ppWVar4 = std::vector<Widget_*,_std::allocator<Widget_*>_>::operator[]
                        (&this_00->children,(long)local_244);
    (**(*ppWVar4)->_vptr_Widget)(local_268,*ppWVar4,(ulong)(local_1c + 1));
    poVar1 = std::operator<<(local_198,local_268);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_268);
    local_244 = local_244 + 1;
  }
  std::operator<<(local_198,"</Scene>");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string SceneW::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<Scene";

	Util::writeXmlAttribute(str, "title", title);
	writeXmlAttributes(str);

	str << ">" << std::endl;

	for (int i = 0; i < children.size(); i++)
	{
		str << children[i]->writeXml(indent + 1) << std::endl;
	}

	str << "</Scene>";
	return str.str();
}